

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroupCollection::CleanupAppend
          (RowGroupCollection *this,transaction_t lowest_transaction,idx_t start,idx_t count)

{
  RowGroup *pRVar1;
  __int_type _Var2;
  RowGroup *in_RCX;
  SegmentTree<duckdb::RowGroup,_true> *in_RDX;
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *in_RDI;
  idx_t append_count;
  idx_t start_in_row_group;
  idx_t remaining;
  idx_t current_row;
  RowGroup *row_group;
  idx_t in_stack_ffffffffffffffa8;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffffb8;
  RowGroup *local_38;
  SegmentTree<duckdb::RowGroup,_true> *local_30;
  idx_t in_stack_ffffffffffffffd8;
  RowGroup *segment;
  SegmentTree<duckdb::RowGroup,_true> *this_00;
  
  shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(in_RDI);
  local_38 = in_RCX;
  local_30 = in_RDX;
  pRVar1 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                     ((SegmentTree<duckdb::RowGroup,_true> *)in_RCX,in_stack_ffffffffffffffd8);
  segment = local_38;
  this_00 = local_30;
  while( true ) {
    pRVar1 = (RowGroup *)((long)local_30 - (pRVar1->super_SegmentBase<duckdb::RowGroup>).start);
    _Var2 = ::std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffb8 =
         (__atomic_base<unsigned_long> *)
         MinValue<unsigned_long>(_Var2 - (long)pRVar1,(unsigned_long)local_38);
    RowGroup::CleanupAppend
              (pRVar1,(transaction_t)in_stack_ffffffffffffffb8,(idx_t)in_RDI,
               in_stack_ffffffffffffffa8);
    local_30 = (SegmentTree<duckdb::RowGroup,_true> *)
               ((long)&local_30->_vptr_SegmentTree + (long)&in_stack_ffffffffffffffb8->_M_i);
    local_38 = (RowGroup *)((long)local_38 - (long)in_stack_ffffffffffffffb8);
    if (local_38 == (RowGroup *)0x0) break;
    shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(in_RDI);
    pRVar1 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment(this_00,segment);
  }
  return;
}

Assistant:

void RowGroupCollection::CleanupAppend(transaction_t lowest_transaction, idx_t start, idx_t count) {
	auto row_group = row_groups->GetSegment(start);
	D_ASSERT(row_group);
	idx_t current_row = start;
	idx_t remaining = count;
	while (true) {
		idx_t start_in_row_group = current_row - row_group->start;
		idx_t append_count = MinValue<idx_t>(row_group->count - start_in_row_group, remaining);

		row_group->CleanupAppend(lowest_transaction, start_in_row_group, append_count);

		current_row += append_count;
		remaining -= append_count;
		if (remaining == 0) {
			break;
		}
		row_group = row_groups->GetNextSegment(row_group);
	}
}